

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

bool __thiscall
QTriangulator<unsigned_short>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,int vertex,int sector)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  Edge *pEVar5;
  QPodPoint *pQVar6;
  bool bVar7;
  long lVar8;
  QPodPoint *v1;
  long lVar9;
  QPodPoint *v3;
  
  lVar8 = (long)sector;
  pEVar5 = (this->m_edges).buffer;
  uVar1 = pEVar5[lVar8].from;
  pQVar6 = (this->m_parent->m_vertices).buffer;
  iVar3 = pQVar6[uVar1].x;
  iVar4 = pQVar6[uVar1].y;
  while( true ) {
    if ((pQVar6[pEVar5[vertex].from].x != iVar3) || (pQVar6[pEVar5[vertex].from].y != iVar4)) break;
    vertex = pEVar5[vertex].next;
  }
  lVar9 = lVar8;
  do {
    lVar9 = (long)pEVar5[lVar9].next;
    uVar2 = pEVar5[lVar9].from;
    if (pQVar6[uVar2].x != iVar3) break;
  } while (pQVar6[uVar2].y == iVar4);
  v3 = pQVar6 + uVar2;
  do {
    lVar8 = (long)pEVar5[lVar8].previous;
    uVar2 = pEVar5[lVar8].from;
    if (pQVar6[uVar2].x != iVar3) break;
  } while (pQVar6[uVar2].y == iVar4);
  v1 = pQVar6 + uVar2;
  if (this->m_clockwiseOrder == true) {
    v1 = v3;
    v3 = pQVar6 + uVar2;
  }
  bVar7 = pointIsInSector(this,pQVar6 + pEVar5[vertex].from,v1,pQVar6 + uVar1,v3);
  return bVar7;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(int vertex, int sector)
{
    const QPodPoint &center = m_parent->m_vertices.at(m_edges.at(sector).from);
    // Handle degenerate edges.
    while (m_parent->m_vertices.at(m_edges.at(vertex).from) == center)
        vertex = m_edges.at(vertex).next;
    int next = m_edges.at(sector).next;
    while (m_parent->m_vertices.at(m_edges.at(next).from) == center)
        next = m_edges.at(next).next;
    int previous = m_edges.at(sector).previous;
    while (m_parent->m_vertices.at(m_edges.at(previous).from) == center)
        previous = m_edges.at(previous).previous;

    const QPodPoint &p = m_parent->m_vertices.at(m_edges.at(vertex).from);
    const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(previous).from);
    const QPodPoint &v3 = m_parent->m_vertices.at(m_edges.at(next).from);
    if (m_clockwiseOrder)
        return pointIsInSector(p, v3, center, v1);
    else
        return pointIsInSector(p, v1, center, v3);
}